

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

void __thiscall xe::xml::Parser::parseEntityValue(Parser *this)

{
  char cVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_3d;
  char value;
  undefined1 local_30 [8];
  string entity;
  Parser *this_local;
  
  entity.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  Tokenizer::getTokenStr(&this->m_tokenizer,(string *)local_30);
  local_3d = getEntityValue((string *)local_30);
  if (local_3d == '\0') {
    std::operator+(&local_80,"Invalid entity \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::operator+(&local_60,&local_80,"\'");
    error(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::resize((ulong)&this->m_entityValue);
  cVar1 = local_3d;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_entityValue);
  *pcVar2 = cVar1;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Parser::parseEntityValue (void)
{
	DE_ASSERT(m_state == STATE_ENTITY && m_tokenizer.getToken() == TOKEN_ENTITY);

	std::string entity;
	m_tokenizer.getTokenStr(entity);

	const char value = getEntityValue(entity);
	if (value == 0)
		error("Invalid entity '" + entity + "'");

	m_entityValue.resize(1);
	m_entityValue[0] = value;
}